

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_pcmpgth_mips(uint64_t fs,uint64_t ft)

{
  long lVar1;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  lVar1 = 0;
  do {
    *(ushort *)((long)&vs + lVar1 * 2) =
         -(ushort)(*(ushort *)((long)&vt + lVar1 * 2) < *(ushort *)((long)&vs + lVar1 * 2));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return vs.d;
}

Assistant:

uint64_t helper_pcmpgth(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; i++) {
        vs.uh[i] = -(vs.uh[i] > vt.uh[i]);
    }
    return vs.d;
}